

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.hpp
# Opt level: O0

void __thiscall Excel::Formula::Formula(Formula *this,Record *record)

{
  Record *in_RDI;
  Formula *unaff_retaddr;
  Record *record_00;
  
  *(undefined4 *)in_RDI = 0;
  (in_RDI->m_stream).super_Stream._vptr_Stream = (_func_int **)0x0;
  (in_RDI->m_stream).super_Stream.m_byteOrder = 0xff;
  (in_RDI->m_stream).super_Stream.field_0xc = 0;
  record_00 = in_RDI;
  std::__cxx11::wstring::wstring((wstring *)&(in_RDI->m_stream).m_stream);
  *(undefined2 *)&(in_RDI->m_stream).field_0x30 = 0;
  *(undefined2 *)&(in_RDI->m_stream).field_0x32 = 0;
  parse(unaff_retaddr,record_00);
  return;
}

Assistant:

inline
Formula::Formula( Record & record )
	:	m_valueType( UnknownValue )
	,	m_doubleValue( 0.0 )
	,	m_errorValue( UnknownError )
	,	m_boolValue( false )
	,	m_row( 0 )
	,	m_column( 0 )
{
	parse( record );
}